

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.h
# Opt level: O0

void __thiscall
CVmMetaclassHTTPRequest::create_for_image_load(CVmMetaclassHTTPRequest *this,vm_obj_id_t id)

{
  int in_ESI;
  undefined8 in_RDI;
  CVmObjTable *unaff_retaddr;
  vm_obj_id_t in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  CVmObject::operator_new(CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  CVmObjHTTPRequest::CVmObjHTTPRequest
            ((CVmObjHTTPRequest *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  CVmObjTable::set_obj_gc_characteristics
            (unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(int)in_RDI,in_ESI);
  CVmObjTable::set_obj_transient
            ((CVmObjTable *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  return;
}

Assistant:

void create_for_image_load(VMG_ vm_obj_id_t id)
    {
        new (vmg_ id) CVmObjHTTPRequest();
        G_obj_table->set_obj_gc_characteristics(id, FALSE, FALSE);
        G_obj_table->set_obj_transient(id);
    }